

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

void Am_Text_Interim_Do_proc
               (Am_Object *inter,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  void *this;
  Am_Object local_e8;
  Am_Input_Char local_dc;
  Am_Object local_d8;
  undefined1 local_d0 [8];
  Am_Text_Edit_Method text_edit_method;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Input_Char local_9c;
  Am_Object local_98;
  Am_Object local_90;
  undefined1 local_88 [8];
  Am_Value old_method;
  Am_Object local_70;
  Am_Text_Abort_Or_Stop_Code local_64;
  Am_Text_Abort_Or_Stop_Code code;
  Am_Object local_58;
  Am_Object local_50 [3];
  Am_Object local_38;
  Am_Object local_30;
  Am_Object text;
  Am_Object *ref_obj_local;
  int mouse_y_local;
  int mouse_x_local;
  Am_Object *inter_local;
  Am_Input_Char ic_local;
  
  text.data = (Am_Object_Data *)ref_obj;
  pAVar2 = Am_Object::Get(inter,0x16d,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  inter_local._6_2_ = ic._2_2_;
  if (((inter_local._6_2_ >> 4 & 0xf) == 1) && ((inter_local._6_2_ >> 8 & 0xf) != 0)) {
    Am_Point_In_Obj(&local_38,(int)&local_30,mouse_x,(Am_Object *)(ulong)(uint)mouse_y);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
    Am_Object::~Am_Object(&local_38);
    if (pAVar3 == (Am_Wrapper *)0x0) {
      local_64 = am_check_text_legal(inter,&local_30);
      switch(local_64) {
      case Am_TEXT_OK:
      case Am_TEXT_STOP_ANYWAY:
        pAVar2 = Am_Object::Get(inter,0x11c,0);
        bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
        if (bVar1) {
          Am_Object::Set(inter,300,1,0);
        }
        else {
          Am_Object::Set(inter,300,0,0);
        }
        Am_Object::Set(inter,0x11c,true,0);
        Am_Object::Am_Object(&local_70,inter);
        Am_Object::Am_Object((Am_Object *)&old_method.value,&local_30);
        bVar1 = text_has_been_edited(&local_70,(Am_Object *)&old_method.value);
        Am_Object::~Am_Object((Am_Object *)&old_method.value);
        Am_Object::~Am_Object(&local_70);
        if (bVar1) {
          pAVar2 = Am_Object::Peek(inter,0xe6,0);
          Am_Value::Am_Value((Am_Value *)local_88,pAVar2);
          Am_Object::Set(inter,0xe6,0,0);
          Am_Object::Am_Object(&local_90,inter);
          Am_Object::Am_Object(&local_98,&local_30);
          local_9c = ic;
          Am_Object::Am_Object(&local_a8,&Am_No_Object);
          Am_Stop_Interactor(&local_90,&local_98,local_9c,&local_a8,0,0,true);
          Am_Object::~Am_Object(&local_a8);
          Am_Object::~Am_Object(&local_98);
          Am_Object::~Am_Object(&local_90);
          bVar1 = Am_Value::Valid((Am_Value *)local_88);
          if (bVar1) {
            Am_Object::Set(inter,0xe6,(Am_Value *)local_88,0);
          }
          Am_Value::~Am_Value((Am_Value *)local_88);
        }
        else {
          Am_Object::Am_Object(&local_b0,inter);
          Am_Abort_Interactor(&local_b0,true);
          Am_Object::~Am_Object(&local_b0);
        }
        break;
      case Am_TEXT_ABORT_AND_RESTORE:
        Am_Object::Am_Object((Am_Object *)&text_edit_method.Call,inter);
        Am_Abort_Interactor((Am_Object *)&text_edit_method.Call,true);
        Am_Object::~Am_Object((Am_Object *)&text_edit_method.Call);
        break;
      case Am_TEXT_KEEP_RUNNING:
        break;
      default:
        poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar4 = std::operator<<(poVar4,"Illegal code=");
        this = (void *)std::ostream::operator<<(poVar4,local_64);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      goto LAB_00244d8c;
    }
    if (1 < (inter_local._6_2_ >> 8 & 0xf)) {
      pAVar2 = Am_Object::Get(inter,0xe5,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (bVar1) {
        Am_Object::Am_Object(local_50,&local_30);
        Am_Set_Pending_Delete(local_50,true);
        Am_Object::~Am_Object(local_50);
        Am_Object::Am_Object(&local_58,&local_30);
        Am_Set_Cut_Buffer_From_Text(&local_58);
        Am_Object::~Am_Object(&local_58);
        goto LAB_00244ccc;
      }
    }
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa0,&local_30);
    move_text_cursor((Am_Object *)&stack0xffffffffffffffa0,mouse_x,mouse_y);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa0);
  }
LAB_00244ccc:
  Am_Text_Edit_Method::Am_Text_Edit_Method((Am_Text_Edit_Method *)local_d0);
  pAVar2 = Am_Object::Get(inter,0xe3,0);
  Am_Text_Edit_Method::operator=((Am_Text_Edit_Method *)local_d0,pAVar2);
  Am_Object::Am_Object(&local_d8,&local_30);
  local_dc = ic;
  Am_Object::Am_Object(&local_e8,inter);
  (*(code *)text_edit_method.from_wrapper)(&local_d8,local_dc,&local_e8);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_d8);
LAB_00244d8c:
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, Am_Text_Interim_Do,
                 (Am_Object inter, int mouse_x, int mouse_y, Am_Object ref_obj,
                  Am_Input_Char ic))
{
  Am_Object text = inter.Get(Am_OBJECT_MODIFIED);

  // move cursor if another mouse down event occurs in the OBJECT_MODIFIED.
  if ((ic.button_down == Am_BUTTON_DOWN) &&
      (static_cast<Am_Click_Count>(ic.click_count) >= Am_SINGLE_CLICK)) {
    if (Am_Point_In_Obj(text, mouse_x, mouse_y, ref_obj)) {
      if (static_cast<Am_Click_Count>(ic.click_count) >= Am_DOUBLE_CLICK &&
          (bool)inter.Get(Am_WANT_PENDING_DELETE)) {
        Am_Set_Pending_Delete(text, true);
        Am_Set_Cut_Buffer_From_Text(text);
      } else
        move_text_cursor(text, mouse_x, mouse_y);
    } else { // click outside the object, exit interactor, but save event
      //check to see if current value is valid first
      Am_Text_Abort_Or_Stop_Code code = am_check_text_legal(inter, text);
      switch (code) {
      case Am_TEXT_OK:
      case Am_TEXT_STOP_ANYWAY: {
        if ((bool)inter.Get(Am_RUN_ALSO))
          inter.Set(Am_REAL_RUN_ALSO, 1);
        else
          inter.Set(Am_REAL_RUN_ALSO, 0);
        inter.Set(Am_RUN_ALSO, true);
        //if the current string is different from the initial string, then call
        // stop_interactor, otherwise, abort the interactor (so stop
        // method not called if just clicking around)
        if (text_has_been_edited(inter, text)) {
          //stop the interactor, but make sure the stop doesn't call
          //the check again
          Am_Value old_method = inter.Peek(Am_TEXT_CHECK_LEGAL_METHOD);
          inter.Set(Am_TEXT_CHECK_LEGAL_METHOD, (0L));
          Am_Stop_Interactor(inter, text, ic);
          if (old_method.Valid())
            inter.Set(Am_TEXT_CHECK_LEGAL_METHOD, old_method);
        } else
          Am_Abort_Interactor(inter);
        return;
      }
      case Am_TEXT_KEEP_RUNNING:
        return; // just ignore this character
      case Am_TEXT_ABORT_AND_RESTORE:
        Am_Abort_Interactor(inter);
        return;
      default:
        Am_ERROR("Illegal code=" << (int)code);
      } //end switch
    }
  }
  Am_Text_Edit_Method text_edit_method;
  text_edit_method = inter.Get(Am_TEXT_EDIT_METHOD);
  text_edit_method.Call(text, ic, inter);
}